

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_Brep::SetVertexTolerance(ON_Brep *this,ON_BrepVertex *vertex,bool bLazySet)

{
  ON_3dPoint *this_00;
  uint uVar1;
  int iVar2;
  double *pdVar3;
  ON_Curve *pOVar4;
  ON_BrepEdge *this_01;
  int i;
  long lVar5;
  ON_BrepTrim *pOVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double local_b8;
  ON_Interval local_98;
  ON_BrepVertex *local_88;
  ulong local_80;
  ON_Curve *local_78;
  ulong local_70;
  long local_68;
  ON_Surface *local_60;
  ON_Interval local_58;
  ON_3dPoint local_48;
  
  if (vertex->m_tolerance <= 0.0 && vertex->m_tolerance != 0.0 || !bLazySet) {
    local_80 = (ulong)(vertex->m_ei).m_count;
    if (0 < (long)local_80) {
      vertex->m_tolerance = -1.23432101234321e+308;
      ON_Interval::ON_Interval(&local_98);
      uVar1 = *(vertex->m_ei).m_a;
      if (-1 < (int)uVar1) {
        iVar2 = vertex->m_vertex_index;
        this_00 = &(vertex->super_ON_Point).point;
        bVar10 = true;
        local_b8 = 0.0;
        uVar9 = 0;
        local_88 = vertex;
        do {
          this_01 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                    m_a + uVar1;
          local_78 = ON_CurveProxy::ProxyCurve(&this_01->super_ON_CurveProxy);
          local_70 = uVar9;
          if (local_78 != (ON_Curve *)0x0) {
            (*(this_01->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x25])(this_01);
            lVar5 = 0;
            do {
              if (this_01->m_vi[lVar5] == iVar2) {
                pdVar3 = ON_Interval::operator[](&local_98,(int)lVar5);
                ON_Curve::PointAt(&local_48,(ON_Curve *)this_01,*pdVar3);
                dVar11 = ON_3dPoint::DistanceTo(this_00,&local_48);
                if (local_b8 < dVar11) {
                  local_b8 = dVar11;
                }
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 == 1);
            local_68 = (long)(this_01->m_ti).m_count;
            if (0 < local_68) {
              lVar5 = 0;
              do {
                uVar1 = (this_01->m_ti).m_a[lVar5];
                pOVar6 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                if (pOVar6 != (ON_BrepTrim *)0x0 &&
                    ((int)uVar1 <
                     (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_count && -1 < (int)uVar1)) {
                  pOVar6 = pOVar6 + uVar1;
                  pOVar4 = ON_BrepTrim::TrimCurveOf(pOVar6);
                  if ((pOVar4 != (ON_Curve *)0x0) &&
                     (local_60 = ON_BrepTrim::SurfaceOf(pOVar6), local_60 != (ON_Surface *)0x0)) {
                    lVar7 = 1;
                    lVar8 = 0;
                    do {
                      if (this_01->m_vi[lVar8] == iVar2) {
                        (*(pOVar6->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                          super_ON_Object._vptr_ON_Object[0x25])(pOVar6);
                        i = (int)lVar8;
                        if (pOVar6->m_bRev3d != false) {
                          i = (int)lVar7;
                        }
                        pdVar3 = ON_Interval::operator[](&local_58,i);
                        ON_Curve::PointAt(&local_48,(ON_Curve *)pOVar6,*pdVar3);
                        ON_Surface::PointAt(&local_48,local_60,local_48.x,local_48.y);
                        dVar11 = ON_3dPoint::DistanceTo(this_00,&local_48);
                        if (local_b8 < dVar11) {
                          local_b8 = dVar11;
                        }
                      }
                      lVar8 = lVar8 + 1;
                      lVar7 = lVar7 + -1;
                    } while (lVar7 == 0);
                  }
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != local_68);
            }
          }
          if (local_78 == (ON_Curve *)0x0) break;
          uVar9 = local_70 + 1;
          bVar10 = uVar9 < local_80;
          if (uVar9 == local_80) {
            local_88->m_tolerance =
                 (double)(~-(ulong)(local_b8 <= 2.3283064365386963e-10) & (ulong)(local_b8 * 1.001))
            ;
            break;
          }
          uVar1 = (local_88->m_ei).m_a[uVar9];
        } while (-1 < (int)uVar1);
        vertex = local_88;
        if (!bVar10) goto LAB_003f95b5;
      }
      return false;
    }
    vertex->m_tolerance = 0.0;
  }
LAB_003f95b5:
  return 0.0 <= vertex->m_tolerance;
}

Assistant:

bool
ON_Brep::SetVertexTolerance( ON_BrepVertex& vertex,
  bool bLazySet // default = false
                // false: recompute tolerance even if
                //        its current value is positive
                // true:  recompute tolerance only if
                //        its current value is nonpositive
  ) const
{
  if ( vertex.m_tolerance < 0.0 || !bLazySet ) {
    const int vertex_edge_count = vertex.EdgeCount();
    if ( vertex_edge_count < 1 ) {
      vertex.m_tolerance = 0.0;
    }
    else {
      vertex.m_tolerance = ON_UNSET_VALUE;
      double tolerance = 0.0;
      double d;
      ON_3dPoint uv;
      ON_Interval edge_domain;
      //const ON_Curve* c=0;
      const ON_Surface* s=0;
      int vei, ei, eti, endi;
      const int vertex_index = vertex.m_vertex_index;
      for ( vei = 0; vei < vertex_edge_count; vei++ ) 
      {
        ei = vertex.m_ei[vei];
        if ( ei < 0 )
          return false;
        const ON_BrepEdge& edge = m_E[ei];
        if ( !edge.ProxyCurve() )
          return false;
        edge_domain = edge.Domain();
        for ( endi = 0; endi < 2; endi++ )
        {
          if ( edge.m_vi[endi] == vertex_index ) 
          {
            d = vertex.point.DistanceTo( edge.PointAt(edge_domain[endi]) );
            if ( tolerance < d )
              tolerance = d;
          }
        }
        const int edge_trim_count = edge.m_ti.Count();
        for ( eti = 0; eti < edge_trim_count; eti++ ) 
        {
          const ON_BrepTrim* trim = Trim(edge.m_ti[eti]);
          if ( 0 == trim )
            continue;
          if ( 0 == trim->TrimCurveOf() )
            continue;
          s = trim->SurfaceOf();
          if ( 0 == s )
            continue;
          for ( endi = 0; endi < 2; endi++ ) {
            if ( edge.m_vi[endi] == vertex_index ) {
              uv = trim->PointAt( trim->Domain()[trim->m_bRev3d?1-endi:endi] );
              d = vertex.point.DistanceTo( s->PointAt(uv.x,uv.y) );
              if ( tolerance < d )
                tolerance = d;
            }
          }
        }
      }
      vertex.m_tolerance = (tolerance <= ON_ZERO_TOLERANCE) ? 0.0 : 1.001*tolerance;
    }
  }
  return (vertex.m_tolerance >= 0.0) ? true : false;
}